

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O1

void __thiscall deqp::egl::RenderTestThread::run(RenderTestThread *this)

{
  deUint32 dVar1;
  long lVar2;
  pointer pDVar3;
  long lVar4;
  
  pDVar3 = (this->m_packets->
           super__Vector_base<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (pDVar3 != (this->m_packets->
                super__Vector_base<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      deSemaphore_decrement(((pDVar3->wait).m_ptr)->m_semaphore);
      (*this->m_egl->_vptr_Library[0x27])
                (this->m_egl,this->m_display,this->m_surface,this->m_surface,this->m_context);
      dVar1 = (*this->m_egl->_vptr_Library[0x1f])();
      eglu::checkError(dVar1,"makeCurrent(m_display, m_surface, m_surface, m_context)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                       ,0x359);
      if (0 < pDVar3->numOps) {
        lVar2 = 0;
        lVar4 = 0;
        do {
          anon_unknown_4::draw
                    (this->m_gl,this->m_api,this->m_program,
                     (DrawPrimitiveOp *)((long)&pDVar3->drawOps->type + lVar2));
          lVar4 = lVar4 + 1;
          lVar2 = lVar2 + 0x48;
        } while (lVar4 < pDVar3->numOps);
      }
      anon_unknown_4::finish(this->m_gl,this->m_api);
      (*this->m_egl->_vptr_Library[0x27])(this->m_egl,this->m_display,0,0,0);
      dVar1 = (*this->m_egl->_vptr_Library[0x1f])();
      eglu::checkError(dVar1,
                       "makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                       ,0x362);
      deSemaphore_increment(((pDVar3->signal).m_ptr)->m_semaphore);
      pDVar3 = pDVar3 + 1;
    } while (pDVar3 != (this->m_packets->
                       super__Vector_base<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void run (void)
	{
		for (std::vector<DrawOpPacket>::const_iterator packetIter = m_packets.begin(); packetIter != m_packets.end(); packetIter++)
		{
			// Wait until it is our turn.
			packetIter->wait->decrement();

			// Acquire context.
			EGLU_CHECK_CALL(m_egl, makeCurrent(m_display, m_surface, m_surface, m_context));

			// Execute rendering.
			for (int ndx = 0; ndx < packetIter->numOps; ndx++)
				draw(m_gl, m_api, m_program, packetIter->drawOps[ndx]);

			finish(m_gl, m_api);

			// Release context.
			EGLU_CHECK_CALL(m_egl, makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));

			// Signal completion.
			packetIter->signal->increment();
		}
	}